

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool.cpp
# Opt level: O2

void RegisterMempoolRPCCommands(CRPCTable *t)

{
  int iVar1;
  CRPCCommand *pcmd;
  long lVar2;
  long in_FS_OFFSET;
  string in_stack_fffffffffffffe68;
  string local_160 [32];
  string local_140 [32];
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (RegisterMempoolRPCCommands(CRPCTable&)::commands == '\0') {
    iVar1 = __cxa_guard_acquire(&RegisterMempoolRPCCommands(CRPCTable&)::commands);
    if (iVar1 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                (local_40,"rawtransactions",(allocator<char> *)&stack0xfffffffffffffe7f);
      CRPCCommand::CRPCCommand
                (RegisterMempoolRPCCommands::commands,in_stack_fffffffffffffe68,
                 (RpcMethodFnType)local_40);
      std::__cxx11::string::string<std::allocator<char>>
                (local_60,"rawtransactions",(allocator<char> *)&stack0xfffffffffffffe7e);
      CRPCCommand::CRPCCommand
                (RegisterMempoolRPCCommands::commands + 1,in_stack_fffffffffffffe68,
                 (RpcMethodFnType)local_60);
      std::__cxx11::string::string<std::allocator<char>>
                (local_80,"blockchain",(allocator<char> *)&stack0xfffffffffffffe7d);
      CRPCCommand::CRPCCommand
                (RegisterMempoolRPCCommands::commands + 2,in_stack_fffffffffffffe68,
                 (RpcMethodFnType)local_80);
      std::__cxx11::string::string<std::allocator<char>>
                (local_a0,"blockchain",(allocator<char> *)&stack0xfffffffffffffe7c);
      CRPCCommand::CRPCCommand
                (RegisterMempoolRPCCommands::commands + 3,in_stack_fffffffffffffe68,
                 (RpcMethodFnType)local_a0);
      std::__cxx11::string::string<std::allocator<char>>
                (local_c0,"blockchain",(allocator<char> *)&stack0xfffffffffffffe7b);
      CRPCCommand::CRPCCommand
                (RegisterMempoolRPCCommands::commands + 4,in_stack_fffffffffffffe68,
                 (RpcMethodFnType)local_c0);
      std::__cxx11::string::string<std::allocator<char>>
                (local_e0,"blockchain",(allocator<char> *)&stack0xfffffffffffffe7a);
      CRPCCommand::CRPCCommand
                (RegisterMempoolRPCCommands::commands + 5,in_stack_fffffffffffffe68,
                 (RpcMethodFnType)local_e0);
      std::__cxx11::string::string<std::allocator<char>>
                (local_100,"blockchain",(allocator<char> *)&stack0xfffffffffffffe79);
      CRPCCommand::CRPCCommand
                (RegisterMempoolRPCCommands::commands + 6,in_stack_fffffffffffffe68,
                 (RpcMethodFnType)local_100);
      std::__cxx11::string::string<std::allocator<char>>
                (local_120,"blockchain",(allocator<char> *)&stack0xfffffffffffffe78);
      CRPCCommand::CRPCCommand
                (RegisterMempoolRPCCommands::commands + 7,in_stack_fffffffffffffe68,
                 (RpcMethodFnType)local_120);
      std::__cxx11::string::string<std::allocator<char>>
                (local_140,"blockchain",(allocator<char> *)&stack0xfffffffffffffe77);
      CRPCCommand::CRPCCommand
                (RegisterMempoolRPCCommands::commands + 8,in_stack_fffffffffffffe68,
                 (RpcMethodFnType)local_140);
      std::__cxx11::string::string<std::allocator<char>>
                (local_160,"blockchain",(allocator<char> *)&stack0xfffffffffffffe76);
      CRPCCommand::CRPCCommand
                (RegisterMempoolRPCCommands::commands + 9,in_stack_fffffffffffffe68,
                 (RpcMethodFnType)local_160);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&stack0xfffffffffffffe80,"rawtransactions",
                 (allocator<char> *)&stack0xfffffffffffffe75);
      CRPCCommand::CRPCCommand
                (RegisterMempoolRPCCommands::commands + 10,in_stack_fffffffffffffe68,
                 (RpcMethodFnType)&stack0xfffffffffffffe80);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffe80);
      std::__cxx11::string::~string(local_160);
      std::__cxx11::string::~string(local_140);
      std::__cxx11::string::~string(local_120);
      std::__cxx11::string::~string(local_100);
      std::__cxx11::string::~string(local_e0);
      std::__cxx11::string::~string(local_c0);
      std::__cxx11::string::~string(local_a0);
      std::__cxx11::string::~string(local_80);
      std::__cxx11::string::~string(local_60);
      std::__cxx11::string::~string(local_40);
      __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
      __cxa_guard_release(&RegisterMempoolRPCCommands(CRPCTable&)::commands);
    }
  }
  pcmd = RegisterMempoolRPCCommands::commands;
  for (lVar2 = 0x580; lVar2 != 0; lVar2 = lVar2 + -0x80) {
    CRPCTable::appendCommand(t,&pcmd->name,pcmd);
    pcmd = pcmd + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void RegisterMempoolRPCCommands(CRPCTable& t)
{
    static const CRPCCommand commands[]{
        {"rawtransactions", &sendrawtransaction},
        {"rawtransactions", &testmempoolaccept},
        {"blockchain", &getmempoolancestors},
        {"blockchain", &getmempooldescendants},
        {"blockchain", &getmempoolentry},
        {"blockchain", &gettxspendingprevout},
        {"blockchain", &getmempoolinfo},
        {"blockchain", &getrawmempool},
        {"blockchain", &importmempool},
        {"blockchain", &savemempool},
        {"rawtransactions", &submitpackage},
    };
    for (const auto& c : commands) {
        t.appendCommand(c.name, &c);
    }
}